

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_asn1.cc
# Opt level: O2

DH * DH_parse_parameters(CBS *cbs)

{
  int iVar1;
  _Head_base<0UL,_dh_st_*,_false> _Var2;
  pointer __p;
  CBS child;
  UniquePtr<DH> ret;
  uint64_t priv_length;
  
  _Var2._M_head_impl = (dh_st *)DH_new();
  ret._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_dh_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<dh_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_data<dh_st,_bssl::internal::Deleter,_true,_true>)_Var2._M_head_impl;
  if ((tuple<dh_st_*,_bssl::internal::Deleter>)_Var2._M_head_impl ==
      (_Head_base<0UL,_dh_st_*,_false>)0x0) {
    _Var2._M_head_impl = (dh_st *)0x0;
    goto LAB_001fc9a8;
  }
  iVar1 = CBS_get_asn1(cbs,&child,0x20000010);
  if (iVar1 == 0) {
LAB_001fc98a:
    iVar1 = 0x38;
  }
  else {
    iVar1 = parse_integer(&child,(BIGNUM **)_Var2._M_head_impl);
    if (iVar1 == 0) goto LAB_001fc98a;
    iVar1 = parse_integer(&child,&(_Var2._M_head_impl)->g);
    if (iVar1 == 0) goto LAB_001fc98a;
    if (child.len == 0) {
LAB_001fc9db:
      iVar1 = dh_check_params_fast(_Var2._M_head_impl);
      if (iVar1 != 0) {
        ret._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_dh_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<dh_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<dh_st,_bssl::internal::Deleter>)0x0;
        goto LAB_001fc9a8;
      }
      iVar1 = 0x4c;
    }
    else {
      iVar1 = CBS_get_asn1_uint64(&child,&priv_length);
      if (priv_length >> 0x20 == 0 && iVar1 != 0) {
        (_Var2._M_head_impl)->priv_length = (int)priv_length;
        if (child.len == 0) goto LAB_001fc9db;
        iVar1 = 0x47;
      }
      else {
        iVar1 = 0x40;
      }
    }
  }
  ERR_put_error(5,0,0x68,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_asn1.cc"
                ,iVar1);
  _Var2._M_head_impl = (dh_st *)0x0;
LAB_001fc9a8:
  std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr(&ret);
  return _Var2._M_head_impl;
}

Assistant:

DH *DH_parse_parameters(CBS *cbs) {
  bssl::UniquePtr<DH> ret(DH_new());
  if (ret == nullptr) {
    return nullptr;
  }

  CBS child;
  if (!CBS_get_asn1(cbs, &child, CBS_ASN1_SEQUENCE) ||
      !parse_integer(&child, &ret->p) ||
      !parse_integer(&child, &ret->g)) {
    OPENSSL_PUT_ERROR(DH, DH_R_DECODE_ERROR);
    return nullptr;
  }

  uint64_t priv_length;
  if (CBS_len(&child) != 0) {
    if (!CBS_get_asn1_uint64(&child, &priv_length) ||
        priv_length > UINT_MAX) {
      OPENSSL_PUT_ERROR(DH, DH_R_DECODE_ERROR);
      return nullptr;
    }
    ret->priv_length = (unsigned)priv_length;
  }

  if (CBS_len(&child) != 0) {
    OPENSSL_PUT_ERROR(DH, DH_R_DECODE_ERROR);
    return nullptr;
  }

  if (!dh_check_params_fast(ret.get())) {
    OPENSSL_PUT_ERROR(DH, DH_R_DECODE_ERROR);
    return nullptr;
  }

  return ret.release();
}